

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

void INT_EVreturn_event_buffer(CManager_conflict cm,void *event)

{
  long lVar1;
  ulong in_RSI;
  long in_RDI;
  queue_item *last;
  queue_item *tmp;
  event_path_data evp;
  long *local_28;
  long *local_20;
  
  lVar1 = *(long *)(in_RDI + 0x118);
  local_28 = (long *)0x0;
  local_20 = *(long **)(lVar1 + 0x68);
  while( true ) {
    if (local_20 == (long *)0x0) {
      fprintf(_stderr,"Event %p not found in taken events list\n",in_RSI);
      return;
    }
    if (((*(ulong *)(*local_20 + 0x20) <= in_RSI) &&
        (in_RSI <= (ulong)(*(long *)(*local_20 + 0x20) + *(long *)(*local_20 + 0x18)))) ||
       ((*(ulong *)(*local_20 + 0x10) <= in_RSI &&
        (in_RSI <= (ulong)(*(long *)(*local_20 + 0x10) + *(long *)(*local_20 + 0x18)))))) break;
    local_28 = local_20;
    local_20 = (long *)local_20[2];
  }
  if (local_28 == (long *)0x0) {
    *(long *)(lVar1 + 0x68) = local_20[2];
  }
  else {
    local_28[2] = local_20[2];
  }
  return_event((event_path_data)cm,(event_item *)event);
  local_20[2] = *(long *)(lVar1 + 0x58);
  *(long **)(lVar1 + 0x58) = local_20;
  return;
}

Assistant:

void
INT_EVreturn_event_buffer(CManager cm, void *event)
{
    event_path_data evp = cm->evp;
    queue_item *tmp, *last = NULL;
    /* search through list for event and then dereference it */
    (void)cm;
    (void)event;

    tmp = evp->taken_events_list;
    while (tmp != NULL) {
	if (((tmp->item->decoded_event <= event) &&
	    ((char *) event <= ((char *) tmp->item->decoded_event + tmp->item->event_len))) ||
	    ((tmp->item->encoded_event <= event) &&
	     ((char *) event <= ((char *) tmp->item->encoded_event + tmp->item->event_len)))) {
	    if (last == NULL) {
		evp->taken_events_list = tmp->next;
	    } else {
		last->next = tmp->next;
	    }
	    return_event(cm->evp, tmp->item);
	    tmp->next = evp->queue_items_free_list;
	    evp->queue_items_free_list = tmp;
	    return;
	}
	last = tmp;
	tmp = tmp->next;
    }
    fprintf(stderr, "Event %p not found in taken events list\n",
	    event);
}